

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
calc_largest_contour
          (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           *contours)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  _InputArray local_60;
  int local_44;
  reference pvStack_40;
  int area;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *c;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  reference pvStack_18;
  int size;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *largest;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *contours_local;
  
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::begin(contours);
  c = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::end(contours);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                *)&c);
    if (!bVar1) break;
    pvStack_40 = __gnu_cxx::
                 __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                 ::operator*(&__end1);
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_60,pvStack_40);
    dVar3 = (double)cv::contourArea(&local_60,false);
    iVar2 = (int)dVar3;
    cv::_InputArray::~_InputArray(&local_60);
    if (__range1._4_4_ < iVar2) {
      pvStack_18 = pvStack_40;
      __range1._4_4_ = iVar2;
    }
    local_44 = iVar2;
    __gnu_cxx::
    __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return pvStack_18;
}

Assistant:

std::vector<cv::Point> const & calc_largest_contour(std::vector<std::vector<cv::Point>> &contours) {
    std::vector<cv::Point> const * largest;
    int size = 0;
    for(auto const & c : contours) {
        int area = cv::contourArea(c);
        if (area > size) {
            largest = &c;
            size = area;
        }
    }
    return *largest;
}